

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nam.cpp
# Opt level: O2

bool mg::data::nam_read(string *data,Nam *out)

{
  long lVar1;
  ulong uVar2;
  pointer local_48;
  char *str;
  int local_34 [2];
  int len;
  
  str = (char *)data->_M_string_length;
  if (((ulong)str & 0x1f) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&out->names);
    for (uVar2 = 0; uVar2 < data->_M_string_length; uVar2 = uVar2 + 0x20) {
      local_34[0] = 0;
      local_48 = (data->_M_dataplus)._M_p + uVar2;
      for (lVar1 = 1; lVar1 != 0x21; lVar1 = lVar1 + 1) {
        if (local_48[lVar1 + -1] == '\r') {
          if (local_48[lVar1] == '\n') goto LAB_0010351d;
        }
        else if (local_48[lVar1 + -1] == '\0') {
LAB_0010351d:
          if (lVar1 == 1) goto LAB_00103532;
          break;
        }
        local_34[0] = (int)lVar1;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*&,int&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)out,&local_48,
                 local_34);
LAB_00103532:
    }
  }
  else {
    fwrite("Wrong size for NAM data file\n",0x1d,1,_stderr);
  }
  return ((ulong)str & 0x1f) == 0;
}

Assistant:

bool nam_read(const std::string &data, Nam &out) {
  // If this file isn't aligned to MAX_STRLEN byte entries, it might not be a
  // NAM
  if (data.size() % Nam::MAX_STRLEN != 0) {
    fprintf(stderr, "Wrong size for NAM data file\n");
    return false;
  }

  // Clear output
  out.names.clear();

  // Iterate each record and add
  std::string::size_type read_offset = 0;
  while (read_offset < data.size()) {
    // Read up to nul byte, max strlen or \r\n
    int len = 0;
    const char *str = &data[read_offset];
    for (; len < Nam::MAX_STRLEN && str[len] != '\0' &&
           !(str[len] == '\r' && str[len + 1] == '\n');
         len++) {
    }
    if (len != 0) {
      out.names.emplace_back(str, len);
    }

    read_offset += Nam::MAX_STRLEN;
  }

  return true;
}